

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

bool __thiscall BamTools::Internal::BamStandardIndex::Create(BamStandardIndex *this)

{
  bool bVar1;
  int iVar2;
  BamReaderPrivate *this_00;
  ostream *poVar3;
  long in_RDI;
  string message_1;
  string readerError_1;
  BamException *e;
  BaiReferenceEntry emptyEntry_2;
  int i_2;
  stringstream s;
  BaiReferenceEntry emptyEntry_1;
  int i_1;
  BaiReferenceEntry emptyEntry;
  int i;
  BaiReferenceEntry refEntry;
  BamAlignment al;
  int32_t lastPosition;
  uint64_t lastOffset;
  uint64_t currentOffset;
  int32_t lastRefID;
  int32_t currentRefID;
  uint32_t lastBin;
  uint32_t currentBin;
  uint32_t defaultValue;
  int *numReferences;
  string indexFilename;
  string message;
  string readerError;
  BamReaderPrivate *in_stack_fffffffffffff878;
  BamAlignment *in_stack_fffffffffffff880;
  allocator *paVar4;
  undefined8 in_stack_fffffffffffff898;
  BamAlignment *in_stack_fffffffffffff8a0;
  int *in_stack_fffffffffffff8a8;
  BamStandardIndex *in_stack_fffffffffffff8b0;
  int *alignmentStartPosition;
  BaiLinearOffsetVector *offsets;
  undefined4 in_stack_fffffffffffff8c0;
  undefined4 in_stack_fffffffffffff8c4;
  string *in_stack_fffffffffffff8d0;
  string *in_stack_fffffffffffff8d8;
  BamIndex *in_stack_fffffffffffff8e0;
  BamStandardIndex *in_stack_fffffffffffff900;
  undefined7 in_stack_fffffffffffff910;
  undefined1 in_stack_fffffffffffff917;
  undefined4 in_stack_fffffffffffff920;
  BamReaderPrivate *in_stack_fffffffffffff928;
  BamStandardIndex *in_stack_fffffffffffff930;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  allocator local_6a9;
  string local_6a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  string local_668 [12];
  OpenMode in_stack_fffffffffffff9a4;
  undefined8 in_stack_fffffffffffff9a8;
  undefined8 in_stack_fffffffffffff9b0;
  int local_5f0;
  allocator local_5e9;
  string local_5e8 [39];
  allocator local_5c1;
  string local_5c0 [32];
  int local_5a0;
  int local_59c;
  string local_598 [39];
  allocator local_571;
  string local_570 [32];
  stringstream local_550 [16];
  ostream local_540 [460];
  int local_374;
  int local_320;
  undefined4 local_31c;
  int local_318;
  int local_2e0 [48];
  int local_220;
  BaiLinearOffsetVector local_21c [7];
  int local_16c;
  BamReaderPrivate *local_168;
  BamReaderPrivate *local_160;
  int local_158;
  int local_154;
  uint local_150;
  uint local_14c;
  undefined4 local_148;
  int local_144;
  int *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  allocator local_d1;
  string local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [47];
  byte local_1;
  
  if ((*(long *)(in_RDI + 8) == 0) ||
     (bVar1 = BamReaderPrivate::IsOpen((BamReaderPrivate *)0x2cdfc7), !bVar1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"BamStandardIndex::Create",&local_31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"could not create index: reader is not open",&local_69);
    BamIndex::SetErrorString
              (in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    local_1 = 0;
  }
  else {
    bVar1 = BamReaderPrivate::Rewind(in_stack_fffffffffffff928);
    if (bVar1) {
      BamReaderPrivate::Filename_abi_cxx11_(in_stack_fffffffffffff878);
      Extension_abi_cxx11_();
      std::operator+(&local_f8,&local_118,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_118);
      OpenFile((BamStandardIndex *)in_stack_fffffffffffff9b0,(string *)in_stack_fffffffffffff9a8,
               in_stack_fffffffffffff9a4);
      iVar2 = BamReaderPrivate::GetReferenceCount((BamReaderPrivate *)0x2ce302);
      local_140 = &local_144;
      local_144 = iVar2;
      ReserveForSummary(in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
      WriteHeader(in_stack_fffffffffffff900);
      local_148 = 0xffffffff;
      local_14c = 0xffffffff;
      local_150 = 0xffffffff;
      local_154 = -1;
      local_158 = -1;
      this_00 = (BamReaderPrivate *)BamReaderPrivate::Tell((BamReaderPrivate *)0x2ce397);
      local_16c = -1;
      local_168 = this_00;
      local_160 = this_00;
      BamAlignment::BamAlignment
                ((BamAlignment *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
      local_31c = 0xffffffff;
      BaiReferenceEntry::BaiReferenceEntry
                ((BaiReferenceEntry *)in_stack_fffffffffffff880,(int32_t *)in_stack_fffffffffffff878
                );
      while (in_stack_fffffffffffff917 =
                  BamReaderPrivate::LoadNextAlignment
                            (this_00,(BamAlignment *)
                                     CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910)),
            (bool)in_stack_fffffffffffff917) {
        if (local_158 == local_220) {
          if ((int)local_21c[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start < local_16c) {
            std::__cxx11::stringstream::stringstream(local_550);
            poVar3 = std::operator<<(local_540,"BAM file is not properly sorted by coordinate");
            poVar3 = (ostream *)
                     std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            poVar3 = std::operator<<(poVar3,"Current alignment position: ");
            poVar3 = (ostream *)
                     std::ostream::operator<<
                               (poVar3,(int)local_21c[0].
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
            poVar3 = std::operator<<(poVar3," < previous alignment position: ");
            in_stack_fffffffffffff8e0 = (BamIndex *)std::ostream::operator<<(poVar3,local_16c);
            in_stack_fffffffffffff8d8 =
                 (string *)
                 std::operator<<((ostream *)in_stack_fffffffffffff8e0," on reference ID: ");
            in_stack_fffffffffffff8d0 =
                 (string *)std::ostream::operator<<(in_stack_fffffffffffff8d8,local_220);
            std::ostream::operator<<
                      (in_stack_fffffffffffff8d0,std::endl<char,std::char_traits<char>>);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_570,"BamStandardIndex::Create",&local_571);
            std::__cxx11::stringstream::str();
            BamIndex::SetErrorString
                      (in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0
                      );
            std::__cxx11::string::~string(local_598);
            std::__cxx11::string::~string(local_570);
            std::allocator<char>::~allocator((allocator<char> *)&local_571);
            local_1 = 0;
            local_59c = 1;
            std::__cxx11::stringstream::~stringstream(local_550);
            goto LAB_002cecf5;
          }
        }
        else {
          if (local_158 == -1) {
            for (local_374 = 0; local_374 < local_220; local_374 = local_374 + 1) {
              BaiReferenceEntry::BaiReferenceEntry
                        ((BaiReferenceEntry *)in_stack_fffffffffffff880,
                         (int32_t *)in_stack_fffffffffffff878);
              WriteReferenceEntry((BamStandardIndex *)in_stack_fffffffffffff880,
                                  (BaiReferenceEntry *)in_stack_fffffffffffff878);
              BaiReferenceEntry::~BaiReferenceEntry((BaiReferenceEntry *)in_stack_fffffffffffff880);
            }
          }
          else {
            SaveAlignmentChunkToBin
                      (in_stack_fffffffffffff930,(BaiBinMap *)in_stack_fffffffffffff928,
                       (uint32_t *)CONCAT44(iVar2,in_stack_fffffffffffff920),(uint64_t *)this_00,
                       (uint64_t *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
            WriteReferenceEntry((BamStandardIndex *)in_stack_fffffffffffff880,
                                (BaiReferenceEntry *)in_stack_fffffffffffff878);
            ClearReferenceEntry((BamStandardIndex *)in_stack_fffffffffffff880,
                                (BaiReferenceEntry *)in_stack_fffffffffffff878);
            local_320 = local_158;
            while (local_320 = local_320 + 1, local_320 < local_220) {
              BaiReferenceEntry::BaiReferenceEntry
                        ((BaiReferenceEntry *)in_stack_fffffffffffff880,
                         (int32_t *)in_stack_fffffffffffff878);
              WriteReferenceEntry((BamStandardIndex *)in_stack_fffffffffffff880,
                                  (BaiReferenceEntry *)in_stack_fffffffffffff878);
              BaiReferenceEntry::~BaiReferenceEntry((BaiReferenceEntry *)in_stack_fffffffffffff880);
            }
            local_160 = local_168;
            local_14c = (uint)local_21c[0].
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_2_;
            local_154 = local_220;
          }
          local_318 = local_220;
          local_158 = local_220;
          local_150 = 0xffffffff;
        }
        if ((-1 < local_220) &&
           (local_21c[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start._4_2_ < 0x1249)) {
          alignmentStartPosition = local_2e0;
          offsets = local_21c;
          local_5a0 = BamAlignment::GetEndPosition
                                (in_stack_fffffffffffff8a0,
                                 SUB81((ulong)in_stack_fffffffffffff898 >> 0x38,0),
                                 SUB81((ulong)in_stack_fffffffffffff898 >> 0x30,0));
          SaveLinearOffsetEntry
                    ((BamStandardIndex *)CONCAT44(local_5a0,in_stack_fffffffffffff8c0),offsets,
                     alignmentStartPosition,in_stack_fffffffffffff8a8,
                     (uint64_t *)in_stack_fffffffffffff8a0);
        }
        if (local_21c[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start._4_2_ != local_150) {
          if (local_14c != 0xffffffff) {
            SaveAlignmentChunkToBin
                      (in_stack_fffffffffffff930,(BaiBinMap *)in_stack_fffffffffffff928,
                       (uint32_t *)CONCAT44(iVar2,in_stack_fffffffffffff920),(uint64_t *)this_00,
                       (uint64_t *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
          }
          local_160 = local_168;
          local_14c = (uint)local_21c[0].
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start._4_2_;
          local_150 = (uint)local_21c[0].
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start._4_2_;
          local_154 = local_220;
          if (local_220 < 0) break;
        }
        in_stack_fffffffffffff8a8 = (int *)BamReaderPrivate::Tell((BamReaderPrivate *)0x2cea6b);
        if ((long)in_stack_fffffffffffff8a8 <= (long)local_168) {
          paVar4 = &local_5c1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_5c0,"BamStandardIndex::Create",paVar4);
          paVar4 = &local_5e9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_5e8,"calculating offsets failed",paVar4);
          BamIndex::SetErrorString
                    (in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
          std::__cxx11::string::~string(local_5e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
          std::__cxx11::string::~string(local_5c0);
          std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
          local_1 = 0;
          local_59c = 1;
          goto LAB_002cecf5;
        }
        local_168 = (BamReaderPrivate *)BamReaderPrivate::Tell((BamReaderPrivate *)0x2cebd4);
        local_16c = (int)local_21c[0].
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start;
      }
      local_5f0 = local_154;
      if (local_168 != local_160) {
        SaveAlignmentChunkToBin
                  (in_stack_fffffffffffff930,(BaiBinMap *)in_stack_fffffffffffff928,
                   (uint32_t *)CONCAT44(iVar2,in_stack_fffffffffffff920),(uint64_t *)this_00,
                   (uint64_t *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
        WriteReferenceEntry((BamStandardIndex *)in_stack_fffffffffffff880,
                            (BaiReferenceEntry *)in_stack_fffffffffffff878);
        local_5f0 = local_154;
      }
      while (local_5f0 = local_5f0 + 1, local_5f0 < *local_140) {
        BaiReferenceEntry::BaiReferenceEntry
                  ((BaiReferenceEntry *)in_stack_fffffffffffff880,
                   (int32_t *)in_stack_fffffffffffff878);
        WriteReferenceEntry((BamStandardIndex *)in_stack_fffffffffffff880,
                            (BaiReferenceEntry *)in_stack_fffffffffffff878);
        BaiReferenceEntry::~BaiReferenceEntry((BaiReferenceEntry *)in_stack_fffffffffffff880);
      }
      local_59c = 0;
LAB_002cecf5:
      BaiReferenceEntry::~BaiReferenceEntry((BaiReferenceEntry *)in_stack_fffffffffffff880);
      BamAlignment::~BamAlignment(in_stack_fffffffffffff880);
      std::__cxx11::string::~string((string *)&local_f8);
      if (local_59c == 0) {
        bVar1 = BamReaderPrivate::Rewind(in_stack_fffffffffffff928);
        if (bVar1) {
          local_1 = 1;
        }
        else {
          BamReaderPrivate::GetErrorString_abi_cxx11_(in_stack_fffffffffffff878);
          std::operator+(&local_688,"could not create index: \n\t",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_668);
          paVar4 = &local_6a9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_6a8,"BamStandardIndex::Create",paVar4);
          BamIndex::SetErrorString
                    (in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
          std::__cxx11::string::~string(local_6a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
          local_1 = 0;
          local_59c = 1;
          std::__cxx11::string::~string((string *)&local_688);
          std::__cxx11::string::~string(local_668);
        }
      }
    }
    else {
      __rhs = &local_90;
      BamReaderPrivate::GetErrorString_abi_cxx11_(in_stack_fffffffffffff878);
      std::operator+(&local_b0,"could not create index: \n\t",__rhs);
      paVar4 = &local_d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d0,"BamStandardIndex::Create",paVar4);
      BamIndex::SetErrorString
                (in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
      std::__cxx11::string::~string(local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      local_1 = 0;
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool BamStandardIndex::Create()
{

    // skip if BamReader is invalid or not open
    if (m_reader == 0 || !m_reader->IsOpen()) {
        SetErrorString("BamStandardIndex::Create", "could not create index: reader is not open");
        return false;
    }

    // rewind BamReader
    if (!m_reader->Rewind()) {
        const std::string readerError = m_reader->GetErrorString();
        const std::string message = "could not create index: \n\t" + readerError;
        SetErrorString("BamStandardIndex::Create", message);
        return false;
    }

    try {

        // open new index file (read & write)
        std::string indexFilename = m_reader->Filename() + Extension();
        OpenFile(indexFilename, IBamIODevice::ReadWrite);

        // initialize BaiFileSummary with number of references
        const int& numReferences = m_reader->GetReferenceCount();
        ReserveForSummary(numReferences);

        // initialize output file
        WriteHeader();

        // set up bin, ID, offset, & coordinate markers
        const uint32_t defaultValue = 0xffffffffu;
        uint32_t currentBin = defaultValue;
        uint32_t lastBin = defaultValue;
        int32_t currentRefID = defaultValue;
        int32_t lastRefID = defaultValue;
        uint64_t currentOffset = (uint64_t)m_reader->Tell();
        uint64_t lastOffset = currentOffset;
        int32_t lastPosition = defaultValue;

        // iterate through alignments in BAM file
        BamAlignment al;
        BaiReferenceEntry refEntry;
        while (m_reader->LoadNextAlignment(al)) {

            // changed to new reference
            if (lastRefID != al.RefID) {

                // if not first reference, save previous reference data
                if (lastRefID != (int32_t)defaultValue) {

                    SaveAlignmentChunkToBin(refEntry.Bins, currentBin, currentOffset, lastOffset);
                    WriteReferenceEntry(refEntry);
                    ClearReferenceEntry(refEntry);

                    // write any empty references between (but *NOT* including) lastRefID & al.RefID
                    for (int i = lastRefID + 1; i < al.RefID; ++i) {
                        BaiReferenceEntry emptyEntry(i);
                        WriteReferenceEntry(emptyEntry);
                    }

                    // update bin markers
                    currentOffset = lastOffset;
                    currentBin = al.Bin;
                    lastBin = al.Bin;
                    currentRefID = al.RefID;
                }

                // otherwise, this is first pass
                // be sure to write any empty references up to (but *NOT* including) current RefID
                else {
                    for (int i = 0; i < al.RefID; ++i) {
                        BaiReferenceEntry emptyEntry(i);
                        WriteReferenceEntry(emptyEntry);
                    }
                }

                // update reference markers
                refEntry.ID = al.RefID;
                lastRefID = al.RefID;
                lastBin = defaultValue;
            }

            // if lastPosition greater than current alignment position - file not sorted properly
            else if (lastPosition > al.Position) {
                std::stringstream s;
                s << "BAM file is not properly sorted by coordinate" << std::endl
                  << "Current alignment position: " << al.Position
                  << " < previous alignment position: " << lastPosition
                  << " on reference ID: " << al.RefID << std::endl;
                SetErrorString("BamStandardIndex::Create", s.str());
                return false;
            }

            // if alignment's ref ID is valid & its bin is not a 'leaf'
            if ((al.RefID >= 0) && (al.Bin < 4681))
                SaveLinearOffsetEntry(refEntry.LinearOffsets, al.Position, al.GetEndPosition(),
                                      lastOffset);

            // changed to new BAI bin
            if (al.Bin != lastBin) {

                // if not first bin on reference, save previous bin data
                if (currentBin != defaultValue)
                    SaveAlignmentChunkToBin(refEntry.Bins, currentBin, currentOffset, lastOffset);

                // update markers
                currentOffset = lastOffset;
                currentBin = al.Bin;
                lastBin = al.Bin;
                currentRefID = al.RefID;

                // if invalid RefID, break out
                if (currentRefID < 0) break;
            }

            // make sure that current file pointer is beyond lastOffset
            if (m_reader->Tell() <= (int64_t)lastOffset) {
                SetErrorString("BamStandardIndex::Create", "calculating offsets failed");
                return false;
            }

            // update lastOffset & lastPosition
            lastOffset = m_reader->Tell();
            lastPosition = al.Position;
        }

        // after finishing alignments, if any data was read, check:
        if (lastOffset != currentOffset) {

            // store last alignment chunk to its bin, then write last reference entry with data
            SaveAlignmentChunkToBin(refEntry.Bins, currentBin, currentOffset, lastOffset);
            WriteReferenceEntry(refEntry);
        }

        // then write any empty references remaining at end of file
        for (int i = currentRefID + 1; i < numReferences; ++i) {
            BaiReferenceEntry emptyEntry(i);
            WriteReferenceEntry(emptyEntry);
        }

    } catch (BamException& e) {
        m_errorString = e.what();
        return false;
    }

    // rewind BamReader
    if (!m_reader->Rewind()) {
        const std::string readerError = m_reader->GetErrorString();
        const std::string message = "could not create index: \n\t" + readerError;
        SetErrorString("BamStandardIndex::Create", message);
        return false;
    }

    // return success
    return true;
}